

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

char * EncodeObservation(pyhanabi_observation_encoder_t *encoder,pyhanabi_observation_t *observation
                        )

{
  char *pcVar1;
  int i;
  ulong uVar2;
  vector<int,_std::allocator<int>_> encoding;
  string obs_str;
  allocator local_61;
  _Vector_base<int,_std::allocator<int>_> local_60;
  char *local_48 [4];
  
  if (encoder == (pyhanabi_observation_encoder_t *)0x0) {
    __assert_fail("encoder != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x363,
                  "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
                 );
  }
  if ((long *)encoder->encoder == (long *)0x0) {
    __assert_fail("encoder->encoder != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x364,
                  "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
                 );
  }
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x365,
                  "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
                 );
  }
  if (observation->observation != (void *)0x0) {
    (**(code **)(*encoder->encoder + 0x18))(&local_60);
    std::__cxx11::string::string((string *)local_48,"",&local_61);
    for (uVar2 = 0;
        uVar2 < (ulong)((long)local_60._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_60._M_impl.super__Vector_impl_data._M_start >> 2);
        uVar2 = uVar2 + 1) {
      std::__cxx11::string::append((char *)local_48);
      if (uVar2 != ((long)local_60._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_60._M_impl.super__Vector_impl_data._M_start >> 2) - 1U) {
        std::__cxx11::string::append((char *)local_48);
      }
    }
    pcVar1 = strdup(local_48[0]);
    std::__cxx11::string::~string((string *)local_48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
    return pcVar1;
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x366,
                "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
               );
}

Assistant:

char* EncodeObservation(pyhanabi_observation_encoder_t* encoder,
                        pyhanabi_observation_t* observation) {
  REQUIRE(encoder != nullptr);
  REQUIRE(encoder->encoder != nullptr);
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  auto obs_enc = reinterpret_cast<hanabi_learning_env::ObservationEncoder*>(
      encoder->encoder);
  auto obs = reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
      observation->observation);
  std::vector<int> encoding = obs_enc->Encode(*obs);
  std::string obs_str = "";
  for (int i = 0; i < encoding.size(); i++) {
    obs_str += (encoding[i] ? "1" : "0");
    if (i != encoding.size() - 1) {
      obs_str += ",";
    }
  }
  return strdup(obs_str.c_str());
}